

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.cpp
# Opt level: O1

StrokeData * __thiscall
lunasvg::SVGGraphicsElement::getStrokeData
          (StrokeData *__return_storage_ptr__,SVGGraphicsElement *this,SVGLayoutState *state)

{
  pointer pLVar1;
  Length *dash;
  pointer length;
  float fVar2;
  DashArray dashArray;
  LengthContext lengthContext;
  vector<float,_std::allocator<float>_> local_88;
  float local_64;
  DashArray *local_60;
  LengthContext local_58;
  pointer local_48;
  float *local_40;
  float *local_38;
  
  local_58.m_units = UserSpaceOnUse;
  local_58.m_element = &this->super_SVGElement;
  fVar2 = LengthContext::valueForLength(&local_58,&state->m_stroke_width,Diagonal);
  __return_storage_ptr__->m_lineWidth = fVar2;
  __return_storage_ptr__->m_miterLimit = 4.0;
  __return_storage_ptr__->m_dashOffset = 0.0;
  __return_storage_ptr__->m_lineCap = Butt;
  __return_storage_ptr__->m_lineJoin = Miter;
  local_60 = &__return_storage_ptr__->m_dashArray;
  (__return_storage_ptr__->m_dashArray).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_dashArray).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_dashArray).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->m_miterLimit = state->m_stroke_miterlimit;
  __return_storage_ptr__->m_lineCap = state->m_stroke_linecap;
  __return_storage_ptr__->m_lineJoin = state->m_stroke_linejoin;
  fVar2 = LengthContext::valueForLength(&local_58,&state->m_stroke_dashoffset,Diagonal);
  __return_storage_ptr__->m_dashOffset = fVar2;
  local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  length = (state->m_stroke_dasharray).
           super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar1 = (state->m_stroke_dasharray).
           super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (length != pLVar1) {
    do {
      local_64 = LengthContext::valueForLength(&local_58,length,Diagonal);
      if (local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_finish ==
          local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (&local_88,
                   (iterator)
                   local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_64);
      }
      else {
        *local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_64;
        local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      length = length + 1;
    } while (length != pLVar1);
  }
  local_48 = local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_40 = local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_38 = local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::_M_move_assign(local_60,&local_48);
  if (local_48 != (pointer)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  if (local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

StrokeData SVGGraphicsElement::getStrokeData(const SVGLayoutState& state) const
{
    LengthContext lengthContext(this);
    StrokeData strokeData(lengthContext.valueForLength(state.stroke_width(), LengthDirection::Diagonal));
    strokeData.setMiterLimit(state.stroke_miterlimit());
    strokeData.setLineCap(state.stroke_linecap());
    strokeData.setLineJoin(state.stroke_linejoin());
    strokeData.setDashOffset(lengthContext.valueForLength(state.stroke_dashoffset(), LengthDirection::Diagonal));

    DashArray dashArray;
    for(const auto& dash : state.stroke_dasharray())
        dashArray.push_back(lengthContext.valueForLength(dash, LengthDirection::Diagonal));
    strokeData.setDashArray(std::move(dashArray));
    return strokeData;
}